

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O3

void __thiscall
poplar::
compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::show_stats(compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *this,ostream *os,int n)

{
  uint64_t uVar1;
  ostream *poVar2;
  int n_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 in_XMM2 [16];
  string indent;
  char local_59;
  long *local_58;
  long local_50;
  long local_48 [2];
  double local_38;
  undefined1 extraout_var [56];
  
  local_58 = local_48;
  auVar4._0_8_ = std::__cxx11::string::_M_construct((ulong)&local_58,(char)n * '\x04');
  auVar4._8_56_ = extraout_var;
  auVar3 = auVar4._0_16_;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"name",4);
  local_59 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"compact_hash_trie",0x11);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  auVar3 = vcvtusi2sd_avx512f(auVar3,this->size_);
  uVar1 = (this->capa_size_).mask_;
  local_38 = auVar3._0_8_;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"factor",6);
  local_59 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  auVar3 = vcvtusi2sd_avx512f(in_XMM2,uVar1 + 1);
  poVar2 = std::ostream::_M_insert<double>((local_38 / auVar3._0_8_) * 100.0);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"max_factor",10);
  local_59 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"size",4);
  local_59 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"alloc_bytes",0xb);
  local_59 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"capa_bits",9);
  local_59 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"symb_bits",9);
  local_59 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"dsp1st_bits",0xb);
  local_59 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"dsp2nd_bits",0xb);
  local_59 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"hasher_",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
  n_00 = n + 1;
  bijective_hash::split_mix_hasher::show_stats(&this->hasher_,os,n_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"aux_cht_",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::show_stats
            (&this->aux_cht_,os,n_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"aux_map_",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
  standard_hash_table<80U,_poplar::hash::vigna_hasher>::show_stats(&this->aux_map_,os,n_00);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_hash_trie");
        show_stat(os, indent, "factor", double(size()) / capa_size() * 100);
        show_stat(os, indent, "max_factor", MaxFactor);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
        show_stat(os, indent, "capa_bits", capa_bits());
        show_stat(os, indent, "symb_bits", symb_bits());
        show_stat(os, indent, "dsp1st_bits", dsp1_bits);
        show_stat(os, indent, "dsp2nd_bits", dsp2_bits);
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "rate_dsp1st", double(num_dsps_[0]) / size());
        show_stat(os, indent, "rate_dsp2nd", double(num_dsps_[1]) / size());
        show_stat(os, indent, "rate_dsp3rd", double(num_dsps_[2]) / size());
        show_stat(os, indent, "num_resize", num_resize_);
#endif
        show_member(os, indent, "hasher_");
        hasher_.show_stats(os, n + 1);
        show_member(os, indent, "aux_cht_");
        aux_cht_.show_stats(os, n + 1);
        show_member(os, indent, "aux_map_");
        aux_map_.show_stats(os, n + 1);
    }